

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_ceb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  gen_helper_ceb(tcg_ctx_00,tcg_ctx_00->cc_op,tcg_ctx_00->cpu_env,o->in1,o->in2);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_ceb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_ceb(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, o->in1, o->in2);
    set_cc_static(s);
    return DISAS_NEXT;
}